

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

void __thiscall Samba::writeXmodem(Samba *this,uint8_t *buffer,int size)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined8 *puVar3;
  size_t __n;
  Samba *this_00;
  byte bVar4;
  int iVar5;
  uint8_t blk [133];
  
  iVar5 = 6;
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) goto LAB_0010adcf;
    iVar2 = (*((this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
  } while (iVar2 != 0x43);
  bVar4 = 1;
  while (0 < size) {
    blk[0] = '\x01';
    blk[2] = ~bVar4;
    __n = 0x80;
    if ((uint)size < 0x80) {
      __n = (size_t)(uint)size;
    }
    this_00 = (Samba *)(blk + 3);
    blk[1] = bVar4;
    memcpy(this_00,buffer,__n);
    if ((uint)size < 0x80) {
      this_00 = (Samba *)(blk + (ulong)(uint)size + 3);
      memset(this_00,0,(ulong)(0x80 - size));
    }
    crc16Add(this_00,blk);
    iVar5 = 6;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) goto LAB_0010adcf;
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,blk,0x85);
      if (iVar2 != 0x85) goto LAB_0010adcf;
      iVar2 = (*((this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    } while (iVar2 != 6);
    buffer = buffer + 0x80;
    bVar4 = bVar4 + 1;
    size = size - 0x80;
  }
  iVar5 = 6;
  while (iVar5 = iVar5 + -1, iVar5 != 0) {
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,4);
    iVar2 = (*((this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    if (iVar2 == 6) {
      return;
    }
  }
LAB_0010adcf:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001175a0;
  __cxa_throw(puVar3,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::writeXmodem(const uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == START)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();

    while (size > 0)
    {
        blk[0] = SOH;
        blk[1] = (blkNum & 0xff);
        blk[2] = ~(blkNum & 0xff);
        memmove(&blk[3], buffer, min(size, BLK_SIZE));
        if (size < BLK_SIZE)
            memset(&blk[3] + size, 0, BLK_SIZE - size);
        crc16Add(blk);

        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            bytes = _port->write(blk, sizeof(blk));
            if (bytes != sizeof(blk))
                throw SambaError();

            if (_port->get() == ACK)
                break;
        }

        if (retries == MAX_RETRIES)
            throw SambaError();

        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        _port->put(EOT);
        if (_port->get() == ACK)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}